

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void emitblock(aec_stream *strm,int k,int ref)

{
  uint *puVar1;
  internal_state *piVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  byte *pbVar9;
  uint *puVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  
  piVar2 = strm->state;
  pbVar9 = piVar2->cds;
  puVar10 = piVar2->block + ref;
  puVar1 = piVar2->block + strm->block_size;
  uVar4 = piVar2->bits;
  uVar12 = (ulong)*pbVar9;
  while (puVar10 < puVar1) {
    uVar13 = uVar12 << 0x38;
    uVar4 = (int)uVar4 % 8 + 0x38;
    for (; (uVar4 - k != 0 && k <= (int)uVar4 && (puVar10 < puVar1)); puVar10 = puVar10 + 1) {
      uVar13 = uVar13 + ((ulong)(*puVar10 & ~(uint)(-1L << ((byte)k & 0x3f))) <<
                        ((char)uVar4 - (byte)k & 0x3f));
      uVar4 = uVar4 - k;
    }
    bVar11 = (byte)(uVar13 >> 0x38);
    bVar5 = (byte)(uVar13 >> 0x18);
    bVar6 = (byte)(uVar13 >> 0x20);
    bVar7 = (byte)(uVar13 >> 0x28);
    bVar8 = (byte)(uVar13 >> 0x30);
    bVar3 = (byte)(uVar13 >> 0x10);
    uVar12 = uVar13 >> 0x38;
    switch(uVar4 >> 3) {
    case 0:
      *pbVar9 = bVar11;
      pbVar9[1] = bVar8;
      pbVar9[2] = bVar7;
      pbVar9[3] = bVar6;
      pbVar9[4] = bVar5;
      pbVar9[5] = bVar3;
      pbVar9[6] = (byte)(uVar13 >> 8);
      pbVar9 = pbVar9 + 7;
      uVar12 = uVar13;
      break;
    case 1:
      *pbVar9 = bVar11;
      pbVar9[1] = bVar8;
      pbVar9[2] = bVar7;
      pbVar9[3] = bVar6;
      pbVar9[4] = bVar5;
      pbVar9[5] = bVar3;
      pbVar9 = pbVar9 + 6;
      uVar12 = uVar13 >> 8;
      break;
    case 2:
      *pbVar9 = bVar11;
      pbVar9[1] = bVar8;
      pbVar9[2] = bVar7;
      pbVar9[3] = bVar6;
      pbVar9[4] = bVar5;
      pbVar9 = pbVar9 + 5;
      uVar12 = uVar13 >> 0x10;
      break;
    case 3:
      *pbVar9 = bVar11;
      pbVar9[1] = bVar8;
      pbVar9[2] = bVar7;
      pbVar9[3] = bVar6;
      pbVar9 = pbVar9 + 4;
      uVar12 = uVar13 >> 0x18;
      break;
    case 4:
      *pbVar9 = bVar11;
      pbVar9[1] = bVar8;
      pbVar9[2] = bVar7;
      pbVar9 = pbVar9 + 3;
      uVar12 = uVar13 >> 0x20;
      break;
    case 5:
      *pbVar9 = bVar11;
      pbVar9[1] = bVar8;
      pbVar9 = pbVar9 + 2;
      uVar12 = uVar13 >> 0x28;
      break;
    case 6:
      *pbVar9 = bVar11;
      pbVar9 = pbVar9 + 1;
      uVar12 = uVar13 >> 0x30;
    }
  }
  *pbVar9 = (byte)uVar12;
  piVar2->cds = pbVar9;
  piVar2->bits = (int)uVar4 % 8;
  return;
}

Assistant:

static inline void emitblock(struct aec_stream *strm, int k, int ref)
{
    /**
       Emit the k LSB of a whole block of input data.
    */

    uint64_t a;
    struct internal_state *state = strm->state;
    uint32_t *in = state->block + ref;
    uint32_t *in_end = state->block + strm->block_size;
    uint64_t mask = (UINT64_C(1) << k) - 1;
    uint8_t *o = state->cds;
    int p = state->bits;

    a = *o;

    while(in < in_end) {
        a <<= 56;
        p = (p % 8) + 56;

        while (p > k && in < in_end) {
            p -= k;
            a += ((uint64_t)(*in++) & mask) << p;
        }

        switch (p & ~7) {
        case 0:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            o[6] = (uint8_t)(a >> 8);
            o += 7;
            break;
        case 8:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            a >>= 8;
            o += 6;
            break;
        case 16:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            a >>= 16;
            o += 5;
            break;
        case 24:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            a >>= 24;
            o += 4;
            break;
        case 32:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            a >>= 32;
            o += 3;
            break;
        case 40:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            a >>= 40;
            o += 2;
            break;
        case 48:
            *o++ = (uint8_t)(a >> 56);
            a >>= 48;
            break;
        default:
            a >>= 56;
            break;
        }
    }

    *o = (uint8_t)a;
    state->cds = o;
    state->bits = p % 8;
}